

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O0

void __thiscall QWidget::initPainter(QWidget *this,QPainter *painter)

{
  QWidget *this_00;
  QBrush *pQVar1;
  pointer pQVar2;
  QFont *pQVar3;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  QPalette *pal;
  QFont f;
  undefined4 in_stack_ffffffffffffff88;
  ColorRole in_stack_ffffffffffffff8c;
  QWidget *in_stack_ffffffffffffff90;
  QFont *this_01;
  QWidget *in_stack_ffffffffffffffa8;
  QPaintDevice *local_40;
  QPen local_20 [8];
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QWidget *)palette(in_stack_ffffffffffffff90);
  foregroundRole(in_stack_ffffffffffffffa8);
  pQVar1 = QPalette::brush((QPalette *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
  QPen::QPen(local_20,pQVar1,1.0,SolidLine,SquareCap,BevelJoin);
  QPainter::d_func((QPainter *)0x3823b2);
  std::unique_ptr<QPainterState,_std::default_delete<QPainterState>_>::operator->
            ((unique_ptr<QPainterState,_std::default_delete<QPainterState>_> *)0x3823be);
  QPen::operator=((QPen *)in_stack_ffffffffffffff90,
                  (QPen *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  QPen::~QPen(local_20);
  backgroundRole(this_00);
  pQVar1 = QPalette::brush((QPalette *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
  QPainter::d_func((QPainter *)0x382408);
  pQVar2 = std::unique_ptr<QPainterState,_std::default_delete<QPainterState>_>::operator->
                     ((unique_ptr<QPainterState,_std::default_delete<QPainterState>_> *)0x382414);
  QBrush::operator=((QBrush *)(pQVar2 + 0x50),pQVar1);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  pQVar3 = font(in_RDI);
  local_40 = (QPaintDevice *)0x0;
  if (in_RDI != (QWidget *)0x0) {
    local_40 = &in_RDI->super_QPaintDevice;
  }
  this_01 = (QFont *)&local_18;
  QFont::QFont(this_01,pQVar3,local_40);
  QPainter::d_func((QPainter *)0x38248f);
  pQVar2 = std::unique_ptr<QPainterState,_std::default_delete<QPainterState>_>::operator->
                     ((unique_ptr<QPainterState,_std::default_delete<QPainterState>_> *)0x38249b);
  QFont::operator=((QFont *)(pQVar2 + 0x30),this_01);
  QPainter::d_func((QPainter *)0x3824b6);
  pQVar2 = std::unique_ptr<QPainterState,_std::default_delete<QPainterState>_>::operator->
                     ((unique_ptr<QPainterState,_std::default_delete<QPainterState>_> *)0x3824c2);
  QFont::operator=((QFont *)(pQVar2 + 0x20),this_01);
  QFont::~QFont(this_01);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidget::initPainter(QPainter *painter) const
{
    const QPalette &pal = palette();
    painter->d_func()->state->pen = QPen(pal.brush(foregroundRole()), 1);
    painter->d_func()->state->bgBrush = pal.brush(backgroundRole());
    QFont f(font(), const_cast<QWidget *>(this));
    painter->d_func()->state->deviceFont = f;
    painter->d_func()->state->font = f;
}